

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O3

string * SDT::writeLabel(void)

{
  uint __val;
  long lVar1;
  long *plVar2;
  uint uVar3;
  size_type *psVar4;
  ulong uVar5;
  string *in_RDI;
  uint uVar6;
  uint __len;
  string __str;
  long *local_50 [2];
  long local_40 [2];
  
  cntTemp = cntTemp + 1;
  __val = -cntTemp;
  if (0 < (int)cntTemp) {
    __val = cntTemp;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar3 = (uint)uVar5;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00107639;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00107639;
      }
      if (uVar3 < 10000) goto LAB_00107639;
      uVar5 = uVar5 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_00107639:
  uVar6 = cntTemp >> 0x1f;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)cntTemp >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)uVar6 + (long)local_50[0]),__len,__val);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x11e1e0);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar2;
    (in_RDI->field_2)._M_allocated_capacity = *psVar4;
  }
  in_RDI->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return in_RDI;
}

Assistant:

string newtemp(){
        return "_t"+to_string(++cntTemp);
    }